

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O2

void __thiscall Gluco::bqueue<unsigned_int>::initSize(bqueue<unsigned_int> *this,int size)

{
  growTo(this,size);
  this->exp = 2.0 / (double)(size + 1);
  return;
}

Assistant:

void initSize(int size) {growTo(size);exp = 2.0/(size+1);}